

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_loadDictionaryContent
                 (ZSTD_matchState_t *ms,ZSTD_CCtx_params *params,void *src,size_t srcSize,
                 ZSTD_dictTableLoadMethod_e dtlm)

{
  BYTE *iend;
  BYTE *pBVar1;
  uint uVar2;
  U32 UVar3;
  BYTE *pBVar4;
  undefined4 extraout_var;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ZSTD_compressionParameters *cParams;
  U32 UVar5;
  ulong uVar6;
  
  iend = (BYTE *)((long)src + srcSize);
  pBVar1 = (ms->window).nextSrc;
  if (pBVar1 == (BYTE *)src) {
    pBVar4 = (ms->window).dictBase;
    UVar3 = (ms->window).lowLimit;
    uVar6 = (ulong)(ms->window).dictLimit;
  }
  else {
    pBVar4 = (ms->window).base;
    uVar6 = (long)pBVar1 - (long)pBVar4;
    UVar3 = (ms->window).dictLimit;
    (ms->window).lowLimit = UVar3;
    UVar5 = (U32)uVar6;
    (ms->window).dictLimit = UVar5;
    (ms->window).dictBase = pBVar4;
    (ms->window).base = (BYTE *)((long)src - uVar6);
    if (UVar5 - UVar3 < 8) {
      (ms->window).lowLimit = UVar5;
      UVar3 = UVar5;
    }
  }
  (ms->window).nextSrc = iend;
  if ((pBVar4 + UVar3 < iend) && (src < pBVar4 + (uVar6 & 0xffffffff))) {
    UVar3 = (U32)((long)iend - (long)pBVar4);
    if ((long)(uVar6 & 0xffffffff) < (long)iend - (long)pBVar4) {
      UVar3 = (U32)uVar6;
    }
    (ms->window).lowLimit = UVar3;
  }
  uVar6 = 0;
  if (params->forceWindow == 0) {
    uVar6 = (ulong)(uint)((int)iend - *(int *)&(ms->window).base);
  }
  ms->loadedDictEnd = (U32)uVar6;
  if (8 < srcSize) {
    uVar2 = (params->cParams).strategy - ZSTD_fast;
    uVar6 = (ulong)uVar2;
    if (uVar2 < 8) {
      cParams = &params->cParams;
      switch(uVar6) {
      case 0:
        ZSTD_fillHashTable(ms,cParams,iend,dtlm);
        uVar6 = extraout_RAX_00;
        break;
      case 1:
        ZSTD_fillDoubleHashTable(ms,cParams,iend,dtlm);
        uVar6 = extraout_RAX_01;
        break;
      default:
        UVar3 = ZSTD_insertAndFindFirstIndex(ms,cParams,iend + -8);
        uVar6 = CONCAT44(extraout_var,UVar3);
        break;
      case 5:
      case 6:
      case 7:
        ZSTD_updateTree(ms,cParams,iend + -8,iend);
        uVar6 = extraout_RAX;
      }
    }
    ms->nextToUpdate = (int)iend - *(int *)&(ms->window).base;
  }
  return uVar6;
}

Assistant:

static size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t* ms,
                                         ZSTD_CCtx_params const* params,
                                         const void* src, size_t srcSize,
                                         ZSTD_dictTableLoadMethod_e dtlm)
{
    const BYTE* const ip = (const BYTE*) src;
    const BYTE* const iend = ip + srcSize;
    ZSTD_compressionParameters const* cParams = &params->cParams;

    ZSTD_window_update(&ms->window, src, srcSize);
    ms->loadedDictEnd = params->forceWindow ? 0 : (U32)(iend - ms->window.base);

    if (srcSize <= HASH_READ_SIZE) return 0;

    switch(params->cParams.strategy)
    {
    case ZSTD_fast:
        ZSTD_fillHashTable(ms, cParams, iend, dtlm);
        break;
    case ZSTD_dfast:
        ZSTD_fillDoubleHashTable(ms, cParams, iend, dtlm);
        break;

    case ZSTD_greedy:
    case ZSTD_lazy:
    case ZSTD_lazy2:
        if (srcSize >= HASH_READ_SIZE)
            ZSTD_insertAndFindFirstIndex(ms, cParams, iend-HASH_READ_SIZE);
        break;

    case ZSTD_btlazy2:   /* we want the dictionary table fully sorted */
    case ZSTD_btopt:
    case ZSTD_btultra:
        if (srcSize >= HASH_READ_SIZE)
            ZSTD_updateTree(ms, cParams, iend-HASH_READ_SIZE, iend);
        break;

    default:
        assert(0);  /* not possible : not a valid strategy id */
    }

    ms->nextToUpdate = (U32)(iend - ms->window.base);
    return 0;
}